

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  long *plVar1;
  long lVar2;
  ptls_t *ppVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  long lVar9;
  ptls_iovec_t pubkey;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  size_t *psVar10;
  int iVar11;
  ptls_key_schedule_t *ppVar12;
  uint *puVar13;
  undefined4 uVar14;
  long *in_RCX;
  long in_RDX;
  size_t *in_RSI;
  long *in_RDI;
  ptls_iovec_t pVar15;
  size_t psk_binder_off;
  size_t body_size;
  size_t body_size_4;
  size_t body_size_27;
  size_t body_size_30;
  size_t body_size_31;
  size_t body_start_31;
  size_t capacity_31;
  size_t body_start_30;
  size_t capacity_30;
  size_t body_size_28;
  uint32_t _v_19;
  size_t body_size_29;
  size_t body_start_29;
  size_t capacity_29;
  size_t body_start_28;
  size_t capacity_28;
  size_t body_start_27;
  size_t capacity_27;
  uint16_t _v_18;
  size_t body_size_26;
  size_t body_start_26;
  size_t capacity_26;
  uint16_t _v_17;
  size_t body_size_24;
  size_t body_size_25;
  size_t body_start_25;
  size_t capacity_25;
  size_t body_start_24;
  size_t capacity_24;
  uint16_t _v_16;
  size_t body_size_22;
  size_t body_size_23;
  size_t body_start_23;
  size_t capacity_23;
  size_t body_start_22;
  size_t capacity_22;
  uint16_t _v_15;
  size_t body_size_20;
  size_t body_size_21;
  size_t body_start_21;
  size_t capacity_21;
  size_t body_start_20;
  size_t capacity_20;
  uint16_t _v_14;
  size_t body_size_18;
  size_t body_size_19;
  uint16_t _v_13;
  size_t body_start_19;
  size_t capacity_19;
  ptls_key_exchange_algorithm_t **algo_1;
  size_t body_start_18;
  size_t capacity_18;
  uint16_t _v_12;
  size_t body_size_17;
  size_t body_start_17;
  size_t capacity_17;
  uint16_t _v_11;
  size_t body_size_15;
  size_t body_size_16;
  uint16_t _v_10;
  size_t i_1;
  size_t body_start_16;
  size_t capacity_16;
  size_t body_start_15;
  size_t capacity_15;
  uint16_t _v_9;
  size_t body_size_13;
  size_t body_size_14;
  uint16_t _v_8;
  uint16_t *algo;
  size_t body_start_14;
  size_t capacity_14;
  size_t body_start_13;
  size_t capacity_13;
  uint16_t _v_7;
  size_t body_size_10;
  size_t body_size_11;
  size_t body_size_12;
  ptls_iovec_t p;
  size_t body_start_12;
  size_t capacity_12;
  size_t i;
  size_t body_start_11;
  size_t capacity_11;
  size_t body_start_10;
  size_t capacity_10;
  uint16_t _v_6;
  size_t body_size_9;
  size_t body_start_9;
  size_t capacity_9;
  uint16_t _v_5;
  size_t body_size_8;
  size_t body_start_8;
  size_t capacity_8;
  uint16_t _v_4;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  uint16_t _v_3;
  size_t body_size_5;
  size_t body_size_6;
  size_t body_start_6;
  size_t capacity_6;
  size_t body_start_5;
  size_t capacity_5;
  uint16_t _v_2;
  anon_struct_16_2_441dca6f key_share_client_hello;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  uint16_t _v_1;
  ptls_cipher_suite_t **cs;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t _v;
  ptls_buffer_t *sendbuf;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  uint32_t max_early_data_size;
  ptls_cipher_suite_t *cipher_suite;
  ptls_key_exchange_algorithm_t *key_share;
  int send_sni;
  int is_second_flight;
  int ret;
  uint8_t binder_key [64];
  size_t msghash_off;
  uint32_t obfuscated_ticket_age;
  char *published_sni;
  ptls_iovec_t resumption_ticket;
  ptls_iovec_t resumption_secret;
  uint *in_stack_fffffffffffff8d8;
  ptls_key_schedule_t *in_stack_fffffffffffff8e0;
  ptls_buffer_t *in_stack_fffffffffffff8e8;
  ptls_key_schedule_t *in_stack_fffffffffffff8f0;
  uint8_t *in_stack_fffffffffffff900;
  ptls_t *in_stack_fffffffffffff908;
  ptls_t *in_stack_fffffffffffff910;
  ptls_t *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  ptls_t *in_stack_fffffffffffff928;
  char *in_stack_fffffffffffff948;
  ptls_buffer_t *in_stack_fffffffffffff950;
  ptls_key_schedule_t *in_stack_fffffffffffff958;
  ptls_esni_secret_t *in_stack_fffffffffffff960;
  uint8_t *in_stack_fffffffffffff968;
  size_t in_stack_fffffffffffff970;
  ptls_t *in_stack_fffffffffffff978;
  ptls_key_schedule_t *in_stack_fffffffffffff980;
  ptls_t *in_stack_fffffffffffff988;
  ptls_cipher_suite_t **in_stack_fffffffffffff990;
  ptls_cipher_suite_t *in_stack_fffffffffffff998;
  uint32_t *in_stack_fffffffffffff9a0;
  ptls_iovec_t *in_stack_fffffffffffff9a8;
  ptls_cipher_suite_t **in_stack_fffffffffffff9b0;
  ptls_key_exchange_algorithm_t **in_stack_fffffffffffff9b8;
  ptls_t *in_stack_fffffffffffff9c0;
  uint32_t *in_stack_fffffffffffff9d0;
  uint8_t *in_stack_fffffffffffff9d8;
  uint8_t *in_stack_fffffffffffff9e0;
  byte local_509;
  long local_4d0;
  long local_4c0;
  long local_498;
  long local_488;
  long local_478;
  long local_458;
  long local_428;
  long local_418;
  long local_3e8;
  long local_3d8;
  long local_3b0;
  long local_3a0;
  long local_370;
  long *local_368;
  long local_358;
  long local_338;
  long local_310;
  long local_300;
  long local_2f0;
  short *local_2c8;
  long local_2b8;
  long local_2a8;
  long local_268;
  long local_260;
  long local_250;
  long local_240;
  long local_220;
  long local_200;
  long local_1e0;
  long local_1b8;
  long local_1a8;
  long local_180;
  long local_160;
  long *local_148;
  long local_138;
  long local_120;
  long local_100;
  uint8_t *local_d0;
  size_t local_c8;
  uint local_bc;
  long local_b8;
  long local_b0;
  uint local_a4;
  uint local_a0;
  int local_9c;
  undefined1 local_98 [64];
  long local_58;
  undefined4 local_4c;
  void *local_48;
  uint8_t *local_30;
  size_t local_28;
  long *local_20;
  long local_18;
  size_t *local_10;
  long *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_30,0,0x10);
  local_48 = (void *)0x0;
  local_4c = 0;
  local_a0 = (uint)(local_8[10] != 0);
  local_509 = 0;
  if (local_8[0x21] != 0) {
    iVar11 = ptls_server_name_is_ipaddr((char *)in_stack_fffffffffffff908);
    local_509 = iVar11 != 0 ^ 0xff;
  }
  local_a4 = (uint)(local_509 & 1);
  if (local_18 != 0) {
    if (((local_a0 == 0) && (local_a4 != 0)) && (*(long *)(local_18 + 0x30) != 0)) {
      pVar15.base._4_4_ = in_stack_fffffffffffff924;
      pVar15.base._0_4_ = in_stack_fffffffffffff920;
      pVar15.len = (size_t)in_stack_fffffffffffff928;
      local_9c = client_setup_esni((ptls_context_t *)in_stack_fffffffffffff918,
                                   (ptls_esni_secret_t **)in_stack_fffffffffffff910,pVar15,
                                   (char **)in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      if ((local_9c != 0) ||
         ((*(long *)(*local_8 + 0xa8) != 0 &&
          (local_9c = (*(code *)**(undefined8 **)(*local_8 + 0xa8))
                                (*(undefined8 *)(*local_8 + 0xa8),local_8,
                                 *(undefined8 *)local_8[0x29],((undefined8 *)local_8[0x29])[1],
                                 *(undefined8 *)(*(long *)(local_8[0x29] + 0x68) + 0x10),
                                 local_8[0x29] + 0x20), local_9c != 0)))) goto LAB_0010fec2;
      local_9c = 0;
    }
    if (*(long *)(local_18 + 0x10) != 0) {
      local_b0 = 0;
      local_b8 = 0;
      in_stack_fffffffffffff8e0 = *(ptls_key_schedule_t **)(local_18 + 0x10);
      in_stack_fffffffffffff8e8 =
           (ptls_buffer_t *)(*(long *)(local_18 + 0x10) + *(long *)(local_18 + 0x18));
      in_stack_fffffffffffff8d8 = &local_bc;
      iVar11 = decode_stored_session_ticket
                         (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                          in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                          in_stack_fffffffffffff9a0,(ptls_iovec_t *)in_stack_fffffffffffff998,
                          in_stack_fffffffffffff9d0,in_stack_fffffffffffff9d8,
                          in_stack_fffffffffffff9e0);
      if (iVar11 == 0) {
        *(byte *)(local_8 + 0x34) = *(byte *)(local_8 + 0x34) & 0xfe | 1;
        if (local_8[0x23] == 0) {
          local_8[0x23] = local_b0;
        }
        local_8[0x24] = local_b8;
        if (((local_a0 == 0) && (local_bc != 0)) && (*(long *)(local_18 + 0x20) != 0)) {
          *(byte *)(local_8 + 0x34) = *(byte *)(local_8 + 0x34) & 0xfd | 2;
          **(ulong **)(local_18 + 0x20) = (ulong)local_bc;
        }
      }
      else {
        pVar15 = ptls_iovec_init((void *)0x0,0);
        local_d0 = pVar15.base;
        local_30 = local_d0;
        local_c8 = pVar15.len;
        local_28 = local_c8;
      }
    }
    if ((*(byte *)(local_8 + 0x34) >> 1 & 1) == 0) {
      if (*(long *)(local_18 + 0x20) != 0) {
        **(undefined8 **)(local_18 + 0x20) = 0;
      }
      *(undefined4 *)(local_18 + 0x28) = 1;
    }
    else {
      *(undefined4 *)(local_18 + 0x28) = 0;
    }
  }
  if ((local_8[0x23] == 0) && ((local_18 == 0 || ((*(byte *)(local_18 + 0x2c) & 1) == 0)))) {
    local_8[0x23] = **(long **)(*local_8 + 0x10);
  }
  if (local_a0 == 0) {
    ppVar12 = key_schedule_new(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                               (char *)in_stack_fffffffffffff988);
    local_8[10] = (long)ppVar12;
    ikm.len = (size_t)in_stack_fffffffffffff968;
    ikm.base = (uint8_t *)in_stack_fffffffffffff960;
    local_9c = key_schedule_extract(in_stack_fffffffffffff958,ikm);
    if (local_9c != 0) goto LAB_0010fec2;
    local_9c = 0;
  }
  psVar10 = local_10;
  local_58 = *(long *)(*local_10 + 0x10) + local_10[2];
  local_9c = (*(code *)local_10[3])(local_10);
  if (local_9c == 0) {
    plVar1 = (long *)*psVar10;
    local_9c = ptls_buffer__do_pushv
                         (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                          (size_t)in_stack_fffffffffffff8d8);
    if (local_9c == 0) {
      local_100 = 3;
      local_9c = ptls_buffer__do_pushv
                           (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                            (size_t)in_stack_fffffffffffff8d8);
      if (local_9c == 0) {
        lVar2 = plVar1[2];
        ppVar3 = (ptls_t *)*local_10;
        local_9c = ptls_buffer__do_pushv
                             (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                              (size_t)in_stack_fffffffffffff8d8);
        if ((local_9c == 0) &&
           (local_9c = ptls_buffer__do_pushv
                                 (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                  (size_t)in_stack_fffffffffffff8d8), local_9c == 0)) {
          local_120 = 1;
          local_9c = ptls_buffer__do_pushv
                               (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                (size_t)in_stack_fffffffffffff8d8);
          if (local_9c == 0) {
            puVar4 = (ppVar3->recvbuf).rec.base;
            local_9c = ptls_buffer__do_pushv
                                 (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                  (size_t)in_stack_fffffffffffff8d8);
            if (local_9c == 0) {
              puVar5 = (ppVar3->recvbuf).rec.base;
              for (; local_120 != 0; local_120 = local_120 + -1) {
                *(char *)((long)ppVar3->ctx + ((long)puVar4 - local_120)) =
                     (char)((ulong)((long)puVar5 - (long)puVar4) >>
                           (((char)local_120 + -1) * '\b' & 0x3fU));
              }
              local_138 = 2;
              local_9c = ptls_buffer__do_pushv
                                   (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                    (size_t)in_stack_fffffffffffff8d8);
              if (local_9c == 0) {
                puVar4 = (ppVar3->recvbuf).rec.base;
                for (local_148 = *(long **)(*local_8 + 0x18); local_9c = 0, *local_148 != 0;
                    local_148 = local_148 + 1) {
                  local_9c = ptls_buffer__do_pushv
                                       (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                        (size_t)in_stack_fffffffffffff8d8);
                  if (local_9c != 0) goto LAB_0010fec2;
                }
                puVar5 = (ppVar3->recvbuf).rec.base;
                for (; local_138 != 0; local_138 = local_138 + -1) {
                  *(char *)((long)ppVar3->ctx + ((long)puVar4 - local_138)) =
                       (char)((ulong)((long)puVar5 - (long)puVar4) >>
                             (((char)local_138 + -1) * '\b' & 0x3fU));
                }
                local_9c = 0;
                local_160 = 1;
                local_9c = ptls_buffer__do_pushv
                                     (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                      (size_t)in_stack_fffffffffffff8d8);
                if (local_9c == 0) {
                  puVar4 = (ppVar3->recvbuf).rec.base;
                  local_9c = ptls_buffer__do_pushv
                                       (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                        (size_t)in_stack_fffffffffffff8d8);
                  if (local_9c == 0) {
                    puVar5 = (ppVar3->recvbuf).rec.base;
                    for (; local_160 != 0; local_160 = local_160 + -1) {
                      *(char *)((long)ppVar3->ctx + ((long)puVar4 - local_160)) =
                           (char)((ulong)((long)puVar5 - (long)puVar4) >>
                                 (((char)local_160 + -1) * '\b' & 0x3fU));
                    }
                    local_180 = 2;
                    local_9c = ptls_buffer__do_pushv
                                         (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                          (size_t)in_stack_fffffffffffff8d8);
                    if (local_9c == 0) {
                      puVar4 = (ppVar3->recvbuf).rec.base;
                      local_9c = ptls_buffer__do_pushv
                                           (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                            (size_t)in_stack_fffffffffffff8d8);
                      if (local_9c == 0) {
                        local_1a8 = 2;
                        local_9c = ptls_buffer__do_pushv
                                             (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                              (size_t)in_stack_fffffffffffff8d8);
                        if (local_9c == 0) {
                          puVar5 = (ppVar3->recvbuf).rec.base;
                          puVar6 = (ppVar3->recvbuf).rec.base;
                          local_1b8 = 2;
                          local_9c = ptls_buffer__do_pushv
                                               (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                                (size_t)in_stack_fffffffffffff8d8);
                          if ((local_9c == 0) &&
                             ((puVar7 = (ppVar3->recvbuf).rec.base, local_8[0x23] == 0 ||
                              ((local_9c = (**(code **)(local_8[0x23] + 8))
                                                     (local_8[0x23],local_8 + 0x33), local_9c == 0
                               && (pubkey.len._0_4_ = in_stack_fffffffffffff920,
                                  pubkey.base = (uint8_t *)in_stack_fffffffffffff918,
                                  pubkey.len._4_4_ = in_stack_fffffffffffff924,
                                  local_9c = push_key_share_entry
                                                       ((ptls_buffer_t *)in_stack_fffffffffffff910,
                                                        (uint16_t)
                                                        ((ulong)in_stack_fffffffffffff908 >> 0x30),
                                                        pubkey), local_9c == 0)))))) {
                            puVar8 = (ppVar3->recvbuf).rec.base;
                            for (; local_1b8 != 0; local_1b8 = local_1b8 + -1) {
                              *(char *)((long)ppVar3->ctx + ((long)puVar7 - local_1b8)) =
                                   (char)((ulong)((long)puVar8 - (long)puVar7) >>
                                         (((char)local_1b8 + -1) * '\b' & 0x3fU));
                            }
                            puVar13 = (uint *)((ppVar3->recvbuf).rec.base + -(long)puVar6);
                            puVar6 = (ppVar3->recvbuf).rec.base;
                            for (; local_1a8 != 0; local_1a8 = local_1a8 + -1) {
                              *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_1a8)) =
                                   (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                         (((char)local_1a8 + -1) * '\b' & 0x3fU));
                            }
                            local_9c = 0;
                            if (local_a4 != 0) {
                              if (local_8[0x29] == 0) {
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                                local_220 = 2;
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                                puVar5 = (ppVar3->recvbuf).rec.base;
                                local_9c = emit_server_name_extension
                                                     (in_stack_fffffffffffff950,
                                                      in_stack_fffffffffffff948);
                                if (local_9c != 0) goto LAB_0010fec2;
                                puVar6 = (ppVar3->recvbuf).rec.base;
                                for (; local_220 != 0; local_220 = local_220 + -1) {
                                  *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_220)) =
                                       (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                             (((char)local_220 + -1) * '\b' & 0x3fU));
                                }
                              }
                              else {
                                if (local_48 != (void *)0x0) {
                                  local_9c = ptls_buffer__do_pushv
                                                       (in_stack_fffffffffffff8e8,
                                                        in_stack_fffffffffffff8e0,
                                                        (size_t)in_stack_fffffffffffff8d8);
                                  if (local_9c != 0) goto LAB_0010fec2;
                                  local_1e0 = 2;
                                  local_9c = ptls_buffer__do_pushv
                                                       (in_stack_fffffffffffff8e8,
                                                        in_stack_fffffffffffff8e0,
                                                        (size_t)in_stack_fffffffffffff8d8);
                                  if (local_9c != 0) goto LAB_0010fec2;
                                  puVar5 = (ppVar3->recvbuf).rec.base;
                                  local_9c = emit_server_name_extension
                                                       (in_stack_fffffffffffff950,
                                                        in_stack_fffffffffffff948);
                                  if (local_9c != 0) goto LAB_0010fec2;
                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                  for (; local_1e0 != 0; local_1e0 = local_1e0 + -1) {
                                    *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_1e0)) =
                                         (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                               (((char)local_1e0 + -1) * '\b' & 0x3fU));
                                  }
                                }
                                local_9c = 0;
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                                local_200 = 2;
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                                puVar5 = (ppVar3->recvbuf).rec.base;
                                esni_keys.len = in_stack_fffffffffffff970;
                                esni_keys.base = in_stack_fffffffffffff968;
                                local_9c = emit_esni_extension(in_stack_fffffffffffff960,
                                                               (ptls_buffer_t *)
                                                               in_stack_fffffffffffff958,esni_keys,
                                                               (char *)in_stack_fffffffffffff950,
                                                               (size_t)in_stack_fffffffffffff948,
                                                               (size_t)in_stack_fffffffffffff980);
                                if (local_9c != 0) goto LAB_0010fec2;
                                puVar6 = (ppVar3->recvbuf).rec.base;
                                for (; in_stack_fffffffffffff8d8 = puVar13, local_200 != 0;
                                    local_200 = local_200 + -1) {
                                  *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_200)) =
                                       (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                             (((char)local_200 + -1) * '\b' & 0x3fU));
                                }
                              }
                            }
                            local_9c = 0;
                            if ((local_18 != 0) && (*(long *)(local_18 + 8) != 0)) {
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c != 0) goto LAB_0010fec2;
                              local_240 = 2;
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c != 0) goto LAB_0010fec2;
                              puVar5 = (ppVar3->recvbuf).rec.base;
                              local_250 = 2;
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c != 0) goto LAB_0010fec2;
                              puVar6 = (ppVar3->recvbuf).rec.base;
                              for (local_260 = 0; local_9c = 0, local_260 != *(long *)(local_18 + 8)
                                  ; local_260 = local_260 + 1) {
                                local_268 = 1;
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                                puVar7 = (ppVar3->recvbuf).rec.base;
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                                puVar8 = (ppVar3->recvbuf).rec.base;
                                for (; local_268 != 0; local_268 = local_268 + -1) {
                                  *(char *)((long)ppVar3->ctx + ((long)puVar7 - local_268)) =
                                       (char)((ulong)((long)puVar8 - (long)puVar7) >>
                                             (((char)local_268 + -1) * '\b' & 0x3fU));
                                }
                              }
                              puVar7 = (ppVar3->recvbuf).rec.base;
                              for (; local_250 != 0; local_250 = local_250 + -1) {
                                *(char *)((long)ppVar3->ctx + ((long)puVar6 - local_250)) =
                                     (char)((ulong)((long)puVar7 - (long)puVar6) >>
                                           (((char)local_250 + -1) * '\b' & 0x3fU));
                              }
                              puVar6 = (ppVar3->recvbuf).rec.base;
                              for (; local_240 != 0; local_240 = local_240 + -1) {
                                *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_240)) =
                                     (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                           (((char)local_240 + -1) * '\b' & 0x3fU));
                              }
                            }
                            local_9c = 0;
                            if (*(long *)(*local_8 + 0xa0) != 0) {
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c != 0) goto LAB_0010fec2;
                              local_2a8 = 2;
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c != 0) goto LAB_0010fec2;
                              puVar5 = (ppVar3->recvbuf).rec.base;
                              local_2b8 = 1;
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c != 0) goto LAB_0010fec2;
                              puVar6 = (ppVar3->recvbuf).rec.base;
                              local_2c8 = (short *)**(undefined8 **)(*local_8 + 0xa0);
                              if (*local_2c8 == -1) {
                                __assert_fail("*algo != UINT16_MAX",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                              ,0x80e,
                                              "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                             );
                              }
                              for (; local_9c = 0, *local_2c8 != -1; local_2c8 = local_2c8 + 1) {
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c != 0) goto LAB_0010fec2;
                              }
                              puVar7 = (ppVar3->recvbuf).rec.base;
                              for (; local_2b8 != 0; local_2b8 = local_2b8 + -1) {
                                *(char *)((long)ppVar3->ctx + ((long)puVar6 - local_2b8)) =
                                     (char)((ulong)((long)puVar7 - (long)puVar6) >>
                                           (((char)local_2b8 + -1) * '\b' & 0x3fU));
                              }
                              puVar6 = (ppVar3->recvbuf).rec.base;
                              for (; local_2a8 != 0; local_2a8 = local_2a8 + -1) {
                                *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_2a8)) =
                                     (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                           (((char)local_2a8 + -1) * '\b' & 0x3fU));
                              }
                            }
                            local_9c = 0;
                            local_9c = ptls_buffer__do_pushv
                                                 (in_stack_fffffffffffff8e8,
                                                  in_stack_fffffffffffff8e0,
                                                  (size_t)in_stack_fffffffffffff8d8);
                            if (local_9c == 0) {
                              local_2f0 = 2;
                              local_9c = ptls_buffer__do_pushv
                                                   (in_stack_fffffffffffff8e8,
                                                    in_stack_fffffffffffff8e0,
                                                    (size_t)in_stack_fffffffffffff8d8);
                              if (local_9c == 0) {
                                puVar5 = (ppVar3->recvbuf).rec.base;
                                local_300 = 1;
                                local_9c = ptls_buffer__do_pushv
                                                     (in_stack_fffffffffffff8e8,
                                                      in_stack_fffffffffffff8e0,
                                                      (size_t)in_stack_fffffffffffff8d8);
                                if (local_9c == 0) {
                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                  for (local_310 = 0; local_9c = 0, local_310 != 4;
                                      local_310 = local_310 + 1) {
                                    local_9c = ptls_buffer__do_pushv
                                                         (in_stack_fffffffffffff8e8,
                                                          in_stack_fffffffffffff8e0,
                                                          (size_t)in_stack_fffffffffffff8d8);
                                    if (local_9c != 0) goto LAB_0010fec2;
                                  }
                                  puVar7 = (ppVar3->recvbuf).rec.base;
                                  for (; local_300 != 0; local_300 = local_300 + -1) {
                                    *(char *)((long)ppVar3->ctx + ((long)puVar6 - local_300)) =
                                         (char)((ulong)((long)puVar7 - (long)puVar6) >>
                                               (((char)local_300 + -1) * '\b' & 0x3fU));
                                  }
                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                  for (; local_2f0 != 0; local_2f0 = local_2f0 + -1) {
                                    *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_2f0)) =
                                         (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                               (((char)local_2f0 + -1) * '\b' & 0x3fU));
                                  }
                                  local_9c = 0;
                                  local_9c = ptls_buffer__do_pushv
                                                       (in_stack_fffffffffffff8e8,
                                                        in_stack_fffffffffffff8e0,
                                                        (size_t)in_stack_fffffffffffff8d8);
                                  if (local_9c == 0) {
                                    local_338 = 2;
                                    local_9c = ptls_buffer__do_pushv
                                                         (in_stack_fffffffffffff8e8,
                                                          in_stack_fffffffffffff8e0,
                                                          (size_t)in_stack_fffffffffffff8d8);
                                    if (local_9c == 0) {
                                      puVar5 = (ppVar3->recvbuf).rec.base;
                                      local_9c = push_signature_algorithms
                                                           ((ptls_verify_certificate_t *)
                                                            CONCAT44(in_stack_fffffffffffff924,
                                                                     in_stack_fffffffffffff920),
                                                            (ptls_buffer_t *)
                                                            in_stack_fffffffffffff918);
                                      if (local_9c == 0) {
                                        puVar6 = (ppVar3->recvbuf).rec.base;
                                        for (; local_338 != 0; local_338 = local_338 + -1) {
                                          *(char *)((long)ppVar3->ctx + ((long)puVar5 - local_338))
                                               = (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                                       (((char)local_338 + -1) * '\b' & 0x3fU));
                                        }
                                        local_9c = ptls_buffer__do_pushv
                                                             (in_stack_fffffffffffff8e8,
                                                              in_stack_fffffffffffff8e0,
                                                              (size_t)in_stack_fffffffffffff8d8);
                                        if (local_9c == 0) {
                                          local_358 = 2;
                                          local_9c = ptls_buffer__do_pushv
                                                               (in_stack_fffffffffffff8e8,
                                                                in_stack_fffffffffffff8e0,
                                                                (size_t)in_stack_fffffffffffff8d8);
                                          if (local_9c == 0) {
                                            puVar5 = (ppVar3->recvbuf).rec.base;
                                            local_368 = *(long **)(*local_8 + 0x10);
                                            local_370 = 2;
                                            local_9c = ptls_buffer__do_pushv
                                                                 (in_stack_fffffffffffff8e8,
                                                                  in_stack_fffffffffffff8e0,
                                                                  (size_t)in_stack_fffffffffffff8d8)
                                            ;
                                            if (local_9c == 0) {
                                              puVar6 = (ppVar3->recvbuf).rec.base;
                                              while( true ) {
                                                iVar11 = (int)((ulong)in_stack_fffffffffffff900 >>
                                                              0x20);
                                                local_9c = 0;
                                                if (*local_368 == 0) break;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                local_368 = local_368 + 1;
                                              }
                                              puVar7 = (ppVar3->recvbuf).rec.base;
                                              for (; local_370 != 0; local_370 = local_370 + -1) {
                                                *(char *)((long)ppVar3->ctx +
                                                         ((long)puVar6 - local_370)) =
                                                     (char)((ulong)((long)puVar7 - (long)puVar6) >>
                                                           (((char)local_370 + -1) * '\b' & 0x3fU));
                                              }
                                              puVar6 = (ppVar3->recvbuf).rec.base;
                                              for (; local_358 != 0; local_358 = local_358 + -1) {
                                                *(char *)((long)ppVar3->ctx +
                                                         ((long)puVar5 - local_358)) =
                                                     (char)((ulong)((long)puVar6 - (long)puVar5) >>
                                                           (((char)local_358 + -1) * '\b' & 0x3fU));
                                              }
                                              local_9c = 0;
                                              if ((local_20 != (long *)0x0) && (*local_20 != 0)) {
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                local_3a0 = 2;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                puVar5 = (ppVar3->recvbuf).rec.base;
                                                local_3b0 = 2;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                puVar6 = (ppVar3->recvbuf).rec.base;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                puVar7 = (ppVar3->recvbuf).rec.base;
                                                for (; local_3b0 != 0; local_3b0 = local_3b0 + -1) {
                                                  *(char *)((long)ppVar3->ctx +
                                                           ((long)puVar6 - local_3b0)) =
                                                       (char)((ulong)((long)puVar7 - (long)puVar6)
                                                             >> (((char)local_3b0 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                                puVar6 = (ppVar3->recvbuf).rec.base;
                                                for (; local_3a0 != 0; local_3a0 = local_3a0 + -1) {
                                                  *(char *)((long)ppVar3->ctx +
                                                           ((long)puVar5 - local_3a0)) =
                                                       (char)((ulong)((long)puVar6 - (long)puVar5)
                                                             >> (((char)local_3a0 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              local_9c = 0;
                                              if ((*(byte *)(*local_8 + 0x70) >> 5 & 1) != 0) {
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                local_3d8 = 2;
                                                in_stack_fffffffffffff980 =
                                                     (ptls_key_schedule_t *)0x2;
                                                in_stack_fffffffffffff988 = ppVar3;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                puVar5 = (ppVar3->recvbuf).rec.base;
                                                local_3e8 = 1;
                                                in_stack_fffffffffffff978 = ppVar3;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                puVar6 = (ppVar3->recvbuf).rec.base;
                                                local_9c = ptls_buffer__do_pushv
                                                                     (in_stack_fffffffffffff8e8,
                                                                      in_stack_fffffffffffff8e0,
                                                                      (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                if (local_9c != 0) goto LAB_0010fec2;
                                                puVar7 = (ppVar3->recvbuf).rec.base;
                                                for (; local_3e8 != 0; local_3e8 = local_3e8 + -1) {
                                                  *(char *)((long)ppVar3->ctx +
                                                           ((long)puVar6 - local_3e8)) =
                                                       (char)((ulong)((long)puVar7 - (long)puVar6)
                                                             >> (((char)local_3e8 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                                puVar6 = (ppVar3->recvbuf).rec.base;
                                                for (; local_3d8 != 0; local_3d8 = local_3d8 + -1) {
                                                  *(char *)((long)ppVar3->ctx +
                                                           ((long)puVar5 - local_3d8)) =
                                                       (char)((ulong)((long)puVar6 - (long)puVar5)
                                                             >> (((char)local_3d8 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                              }
                                              local_9c = 0;
                                              local_9c = push_additional_extensions
                                                                   ((ptls_handshake_properties_t *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff924,
                                                  in_stack_fffffffffffff920),
                                                  (ptls_buffer_t *)in_stack_fffffffffffff918);
                                              if (local_9c == 0) {
                                                if ((*(long *)(*local_8 + 0x80) != 0) ||
                                                   (local_30 != (uint8_t *)0x0)) {
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  local_418 = 2;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar5 = (ppVar3->recvbuf).rec.base;
                                                  local_428 = 1;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if ((local_9c != 0) ||
                                                     ((puVar6 = (ppVar3->recvbuf).rec.base,
                                                      (*(byte *)(*local_8 + 0x70) & 1) == 0 &&
                                                      (local_9c = ptls_buffer__do_pushv
                                                                            (
                                                  in_stack_fffffffffffff8e8,
                                                  in_stack_fffffffffffff8e0,
                                                  (size_t)in_stack_fffffffffffff8d8), local_9c != 0)
                                                  ))) goto LAB_0010fec2;
                                                  local_9c = 0;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar7 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_428 != 0; local_428 = local_428 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar6 - local_428)) =
                                                         (char)((ulong)((long)puVar7 - (long)puVar6)
                                                               >> (((char)local_428 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_418 != 0; local_418 = local_418 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar5 - local_418)) =
                                                         (char)((ulong)((long)puVar6 - (long)puVar5)
                                                               >> (((char)local_418 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                }
                                                local_9c = 0;
                                                if (local_30 != (uint8_t *)0x0) {
                                                  if (((*(byte *)(local_8 + 0x34) >> 1 & 1) != 0) &&
                                                     (local_a0 == 0)) {
                                                    local_9c = ptls_buffer__do_pushv
                                                                         (in_stack_fffffffffffff8e8,
                                                                          in_stack_fffffffffffff8e0,
                                                                          (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  local_458 = 2;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar5 = (ppVar3->recvbuf).rec.base;
                                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_458 != 0; local_458 = local_458 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar5 - local_458)) =
                                                         (char)((ulong)((long)puVar6 - (long)puVar5)
                                                               >> (((char)local_458 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                  }
                                                  local_9c = 0;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  local_478 = 2;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar5 = (ppVar3->recvbuf).rec.base;
                                                  local_488 = 2;
                                                  in_stack_fffffffffffff924 = 0;
                                                  in_stack_fffffffffffff928 = ppVar3;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                                  local_498 = 2;
                                                  in_stack_fffffffffffff910 = (ptls_t *)0x2;
                                                  in_stack_fffffffffffff918 = ppVar3;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar7 = (ppVar3->recvbuf).rec.base;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar8 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_498 != 0; local_498 = local_498 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar7 - local_498)) =
                                                         (char)((ulong)((long)puVar8 - (long)puVar7)
                                                               >> (((char)local_498 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar7 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_488 != 0; local_488 = local_488 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar6 - local_488)) =
                                                         (char)((ulong)((long)puVar7 - (long)puVar6)
                                                               >> (((char)local_488 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                  local_4c0 = 2;
                                                  iVar11 = 0;
                                                  in_stack_fffffffffffff908 = ppVar3;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                                  local_4d0 = 1;
                                                  in_stack_fffffffffffff8f0 =
                                                       (ptls_key_schedule_t *)0x1;
                                                  local_9c = ptls_buffer__do_pushv
                                                                       (in_stack_fffffffffffff8e8,
                                                                        in_stack_fffffffffffff8e0,
                                                                        (size_t)
                                                  in_stack_fffffffffffff8d8);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  puVar7 = (ppVar3->recvbuf).rec.base;
                                                  local_9c = ptls_buffer_reserve(
                                                  in_stack_fffffffffffff8e8,
                                                  (size_t)in_stack_fffffffffffff8e0);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  (ppVar3->recvbuf).rec.base =
                                                       (ppVar3->recvbuf).rec.base +
                                                       *(long *)(*(long *)(local_8[10] + 0x58) + 8);
                                                  puVar8 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_4d0 != 0; local_4d0 = local_4d0 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar7 - local_4d0)) =
                                                         (char)((ulong)((long)puVar8 - (long)puVar7)
                                                               >> (((char)local_4d0 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                  puVar7 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_4c0 != 0; local_4c0 = local_4c0 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar6 - local_4c0)) =
                                                         (char)((ulong)((long)puVar7 - (long)puVar6)
                                                               >> (((char)local_4c0 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                  puVar6 = (ppVar3->recvbuf).rec.base;
                                                  for (; local_478 != 0; local_478 = local_478 + -1)
                                                  {
                                                    *(char *)((long)ppVar3->ctx +
                                                             ((long)puVar5 - local_478)) =
                                                         (char)((ulong)((long)puVar6 - (long)puVar5)
                                                               >> (((char)local_478 + -1) * '\b' &
                                                                  0x3fU));
                                                  }
                                                }
                                                local_9c = 0;
                                                puVar5 = (ppVar3->recvbuf).rec.base;
                                                for (; local_180 != 0; local_180 = local_180 + -1) {
                                                  *(char *)((long)ppVar3->ctx +
                                                           ((long)puVar4 - local_180)) =
                                                       (char)((ulong)((long)puVar5 - (long)puVar4)
                                                             >> (((char)local_180 + -1) * '\b' &
                                                                0x3fU));
                                                }
                                                lVar9 = plVar1[2];
                                                for (; local_100 != 0; local_100 = local_100 + -1) {
                                                  *(char *)(*plVar1 + (lVar2 - local_100)) =
                                                       (char)((ulong)(lVar9 - lVar2) >>
                                                             (((char)local_100 + -1) * '\b' & 0x3fU)
                                                             );
                                                }
                                                local_9c = (*(code *)psVar10[4])(psVar10);
                                                if (local_9c == 0) {
                                                  if (local_30 != (uint8_t *)0x0) {
                                                    lVar2 = *(long *)(*local_10 + 0x10);
                                                    lVar9 = *(long *)(*(long *)(local_8[10] + 0x58)
                                                                     + 8);
                                                    local_9c = derive_secret_with_empty_digest
                                                                         (in_stack_fffffffffffff8e0,
                                                                          in_stack_fffffffffffff8d8,
                                                                          (char *)0x10fce0);
                                                    if (local_9c != 0) goto LAB_0010fec2;
                                                    ptls__key_schedule_update_hash
                                                              (in_stack_fffffffffffff8f0,
                                                               (uint8_t *)in_stack_fffffffffffff8e8,
                                                               (size_t)in_stack_fffffffffffff8e0);
                                                    local_58 = lVar2 - (lVar9 + 3);
                                                    local_9c = calc_verify_data(
                                                  in_stack_fffffffffffff988,
                                                  in_stack_fffffffffffff980,
                                                  in_stack_fffffffffffff978);
                                                  if (local_9c != 0) goto LAB_0010fec2;
                                                  }
                                                  local_9c = 0;
                                                  ptls__key_schedule_update_hash
                                                            (in_stack_fffffffffffff8f0,
                                                             (uint8_t *)in_stack_fffffffffffff8e8,
                                                             (size_t)in_stack_fffffffffffff8e0);
                                                  if ((*(byte *)(local_8 + 0x34) >> 1 & 1) != 0) {
                                                    if (local_a0 != 0) {
                                                      __assert_fail("!is_second_flight",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0x85f,
                                                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                                  );
                                                  }
                                                  local_9c = setup_traffic_protection
                                                                       (in_stack_fffffffffffff928,
                                                                        in_stack_fffffffffffff924,
                                                                        (char *)
                                                  in_stack_fffffffffffff918,
                                                  (size_t)in_stack_fffffffffffff910,
                                                  (int)((ulong)in_stack_fffffffffffff908 >> 0x20));
                                                  if ((local_9c != 0) ||
                                                     (local_9c = push_change_cipher_spec
                                                                           (
                                                  in_stack_fffffffffffff910,
                                                  (ptls_message_emitter_t *)
                                                  in_stack_fffffffffffff908), local_9c != 0))
                                                  goto LAB_0010fec2;
                                                  local_9c = 0;
                                                  }
                                                  if (((local_30 == (uint8_t *)0x0) ||
                                                      (local_a0 != 0)) ||
                                                     (local_9c = derive_exporter_secret
                                                                           (
                                                  in_stack_fffffffffffff908,iVar11), local_9c == 0))
                                                  {
                                                    uVar14 = 2;
                                                    if (local_20 == (long *)0x0) {
                                                      uVar14 = 1;
                                                    }
                                                    *(undefined4 *)(local_8 + 1) = uVar14;
                                                    local_9c = 0x202;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010fec2:
  if (local_48 != (void *)0x0) {
    free(local_48);
  }
  (*ptls_clear_memory)(local_98,0x40);
  return local_9c;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(tls->ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (tls->ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}